

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

void __thiscall CEPlanet::copy_members(CEPlanet *this,CEPlanet *other)

{
  void *pvVar1;
  long in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000068;
  vector<double,_std::allocator<double>_> *in_stack_00000070;
  
  *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(in_RSI + 0x50);
  *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(in_RSI + 0x58);
  *(undefined8 *)(in_RDI + 0x60) = *(undefined8 *)(in_RSI + 0x60);
  if (*(long *)(in_RSI + 0x68) != 0) {
    if (*(long *)(in_RDI + 0x68) != 0) {
      if (*(long **)(in_RDI + 0x68) != (long *)0x0) {
        (**(code **)(**(long **)(in_RDI + 0x68) + 8))();
      }
      *(undefined8 *)(in_RDI + 0x68) = 0;
    }
    pvVar1 = operator_new(0x140);
    CEPlanet(this,other);
    *(void **)(in_RDI + 0x68) = pvVar1;
  }
  *(undefined4 *)(in_RDI + 0x70) = *(undefined4 *)(in_RSI + 0x70);
  *(undefined8 *)(in_RDI + 0x78) = *(undefined8 *)(in_RSI + 0x78);
  *(undefined8 *)(in_RDI + 0x80) = *(undefined8 *)(in_RSI + 0x80);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000070,in_stack_00000068);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000070,in_stack_00000068);
  *(undefined8 *)(in_RDI + 0xb8) = *(undefined8 *)(in_RSI + 0xb8);
  *(undefined8 *)(in_RDI + 0xc0) = *(undefined8 *)(in_RSI + 0xc0);
  *(undefined8 *)(in_RDI + 200) = *(undefined8 *)(in_RSI + 200);
  *(undefined8 *)(in_RDI + 0xd0) = *(undefined8 *)(in_RSI + 0xd0);
  *(undefined8 *)(in_RDI + 0xd8) = *(undefined8 *)(in_RSI + 0xd8);
  *(undefined8 *)(in_RDI + 0xe0) = *(undefined8 *)(in_RSI + 0xe0);
  *(undefined8 *)(in_RDI + 0xe8) = *(undefined8 *)(in_RSI + 0xe8);
  *(undefined8 *)(in_RDI + 0xf0) = *(undefined8 *)(in_RSI + 0xf0);
  *(undefined8 *)(in_RDI + 0xf8) = *(undefined8 *)(in_RSI + 0xf8);
  *(undefined8 *)(in_RDI + 0x100) = *(undefined8 *)(in_RSI + 0x100);
  *(undefined8 *)(in_RDI + 0x108) = *(undefined8 *)(in_RSI + 0x108);
  *(undefined8 *)(in_RDI + 0x110) = *(undefined8 *)(in_RSI + 0x110);
  *(undefined8 *)(in_RDI + 0x118) = *(undefined8 *)(in_RSI + 0x118);
  *(undefined8 *)(in_RDI + 0x120) = *(undefined8 *)(in_RSI + 0x120);
  *(undefined8 *)(in_RDI + 0x128) = *(undefined8 *)(in_RSI + 0x128);
  *(undefined8 *)(in_RDI + 0x130) = *(undefined8 *)(in_RSI + 0x130);
  *(undefined8 *)(in_RDI + 0x138) = *(undefined8 *)(in_RSI + 0x138);
  return;
}

Assistant:

void CEPlanet::copy_members(const CEPlanet& other)
{
    // Basic properties
    radius_m_ = other.radius_m_;
    mass_kg_  = other.mass_kg_;
    albedo_   = other.albedo_;
    
    // The following is a reference point for the observer
    // This will almost always be the Earth-Moon barycenter
    if (other.reference_ != nullptr) {
        if (reference_ != nullptr) {
            delete reference_;
            reference_ = nullptr;
        }
        reference_ = new CEPlanet(*other.reference_);
    }

    // Define the algorithm used to compute the planets position
    algorithm_type_ = other.algorithm_type_;
    /// Sofa planet id (note: 3.5 implies the earth-center which uses a different method
    /// than the other planets)
    sofa_planet_id_ = other.sofa_planet_id_;
    
    // The coordinates representing the current position will need to be
    // relative to some date, since planets move. This is the cached date
    cached_jd_ = other.cached_jd_;
    pos_icrs_  = other.pos_icrs_;
    vel_icrs_  = other.vel_icrs_;
    
    /******************************************
     * Properties for the JPL algorithm
     ******************************************/
    // Orbital properties (element 2 is the derivative)
    semi_major_axis_au_     = other.semi_major_axis_au_;
    eccentricity_           = other.eccentricity_;
    inclination_deg_        = other.inclination_deg_;
    mean_longitude_deg_     = other.mean_longitude_deg_;
    perihelion_lon_deg_     = other.perihelion_lon_deg_;
    ascending_node_lon_deg_ = other.ascending_node_lon_deg_;
    
    // Derivatives of orbital properties
    semi_major_axis_au_per_cent_     = other.semi_major_axis_au_per_cent_;
    eccentricity_per_cent_           = other.eccentricity_per_cent_;
    inclination_deg_per_cent_        = other.inclination_deg_per_cent_;
    mean_longitude_deg_per_cent_     = other.mean_longitude_deg_per_cent_;
    perihelion_long_deg_per_cent_    = other.perihelion_long_deg_per_cent_;
    ascending_node_lon_deg_per_cent_ = other.ascending_node_lon_deg_per_cent_;
    
    // The following is the tolerance for the computation of eccentric anomoly
    E_tol = other.E_tol;
    
    // Extra terms for outer planets (Jupiter, Saturn, Uranus, Neptune, and Pluto)
    b_ = other.b_;
    c_ = other.c_;
    s_ = other.s_;
    f_ = other.f_;
}